

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite.cpp
# Opt level: O0

void __thiscall wallet::SQLiteDatabase::Open(SQLiteDatabase *this)

{
  string_view source_file;
  string_view source_file_00;
  string_view logging_function;
  string_view logging_function_00;
  bool bVar1;
  int iVar2;
  int iVar3;
  char *pcVar4;
  runtime_error *prVar5;
  long *in_RDI;
  long in_FS_OFFSET;
  uint32_t app_id;
  bool table_exists;
  int ret;
  int ret_1;
  int flags;
  sqlite3_stmt *check_main_stmt;
  undefined4 in_stack_fffffffffffffaa8;
  undefined4 in_stack_fffffffffffffaac;
  char *in_stack_fffffffffffffab0;
  char *in_stack_fffffffffffffac0;
  basic_string_view<char,_std::char_traits<char>_> *in_stack_fffffffffffffac8;
  path *in_stack_fffffffffffffad0;
  string *in_stack_fffffffffffffad8;
  char *fmt;
  allocator<char> *in_stack_fffffffffffffae8;
  allocator<char> *paVar6;
  char *in_stack_fffffffffffffaf0;
  string *in_stack_fffffffffffffaf8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this_00;
  string *in_stack_fffffffffffffb00;
  string *in_stack_fffffffffffffb08;
  sqlite3 *in_stack_fffffffffffffb10;
  undefined8 in_stack_fffffffffffffb18;
  ConstevalFormatString<0U> in_stack_fffffffffffffb58;
  size_t in_stack_fffffffffffffb60;
  allocator<char> *paVar7;
  char *in_stack_fffffffffffffb68;
  allocator<char> *paVar8;
  size_t in_stack_fffffffffffffb70;
  size_t sVar9;
  char *in_stack_fffffffffffffb78;
  undefined4 local_3c4;
  allocator<char> local_3b3;
  allocator<char> local_3b2;
  allocator<char> local_3b1;
  Level in_stack_fffffffffffffc50;
  allocator<char> local_3a9 [9];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffc60;
  undefined8 local_388;
  allocator<char> local_37b;
  allocator<char> local_37a;
  allocator<char> local_379 [38];
  allocator<char> local_353;
  allocator<char> local_352;
  allocator<char> local_351;
  undefined8 local_350;
  allocator<char> local_343;
  allocator<char> local_342;
  allocator<char> local_341 [33];
  undefined8 local_320;
  undefined8 local_318;
  string local_250 [32];
  string local_230 [32];
  string local_210 [32];
  string local_1f0 [224];
  string local_110 [160];
  string local_70 [32];
  string local_50 [72];
  long local_8;
  
  iVar3 = (int)((ulong)in_stack_fffffffffffffb18 >> 0x20);
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_3c4 = 0x10006;
  if ((*(byte *)(in_RDI + 4) & 1) != 0) {
    local_3c4 = 0x10086;
  }
  if (in_RDI[0x19] == 0) {
    if ((*(byte *)(in_RDI + 4) & 1) == 0) {
      fs::PathFromString(in_stack_fffffffffffffad8);
      TryCreateDirectories(in_stack_fffffffffffffad0);
      fs::path::~path((path *)CONCAT44(in_stack_fffffffffffffaac,in_stack_fffffffffffffaa8));
    }
    pcVar4 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::c_str
                       ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        CONCAT44(in_stack_fffffffffffffaac,in_stack_fffffffffffffaa8));
    iVar2 = sqlite3_open_v2(pcVar4,in_RDI + 0x19,local_3c4,0);
    if (iVar2 != 0) {
      prVar5 = (runtime_error *)__cxa_allocate_exception(0x10);
      local_318 = sqlite3_errstr(iVar2);
      tinyformat::format<char_const*>
                ((char *)in_stack_fffffffffffffad8,(char **)in_stack_fffffffffffffad0);
      std::runtime_error::runtime_error(prVar5,local_50);
      if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
        __cxa_throw(prVar5,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
      }
      goto LAB_017ab07b;
    }
    iVar2 = sqlite3_extended_result_codes(in_RDI[0x19],1);
    if (iVar2 != 0) {
      prVar5 = (runtime_error *)__cxa_allocate_exception(0x10);
      local_320 = sqlite3_errstr(iVar2);
      tinyformat::format<char_const*>
                ((char *)in_stack_fffffffffffffad8,(char **)in_stack_fffffffffffffad0);
      std::runtime_error::runtime_error(prVar5,local_70);
      if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
        __cxa_throw(prVar5,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
      }
      goto LAB_017ab07b;
    }
    bVar1 = ::LogAcceptCategory(CONCAT44(in_stack_fffffffffffffaac,in_stack_fffffffffffffaa8),Trace)
    ;
    if ((bVar1) && (iVar2 = sqlite3_trace_v2(in_RDI[0x19],1,TraceSqlCallback), iVar2 != 0)) {
      std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                (in_stack_fffffffffffffac8,in_stack_fffffffffffffac0);
      std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                (in_stack_fffffffffffffac8,in_stack_fffffffffffffac0);
      (**(code **)(*in_RDI + 0x60))();
      in_stack_fffffffffffffab0 = "Failed to enable SQL tracing for %s\n";
      in_stack_fffffffffffffaa8 = 2;
      logging_function._M_str = in_stack_fffffffffffffb78;
      logging_function._M_len = in_stack_fffffffffffffb70;
      source_file._M_str = in_stack_fffffffffffffb68;
      source_file._M_len = in_stack_fffffffffffffb60;
      LogPrintFormatInternal<std::__cxx11::string>
                (logging_function,source_file,iVar3,(LogFlags)in_stack_fffffffffffffb10,
                 in_stack_fffffffffffffc50,(ConstevalFormatString<1U>)in_stack_fffffffffffffb58.fmt,
                 in_stack_fffffffffffffc60);
      std::__cxx11::string::~string
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT44(in_stack_fffffffffffffaac,in_stack_fffffffffffffaa8));
    }
  }
  iVar2 = sqlite3_db_readonly(in_RDI[0x19],"main");
  if (iVar2 == 0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_fffffffffffffaf8,in_stack_fffffffffffffaf0,in_stack_fffffffffffffae8);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_fffffffffffffaf8,in_stack_fffffffffffffaf0,in_stack_fffffffffffffae8);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_fffffffffffffaf8,in_stack_fffffffffffffaf0,in_stack_fffffffffffffae8);
    SetPragma(in_stack_fffffffffffffb10,in_stack_fffffffffffffb08,in_stack_fffffffffffffb00,
              in_stack_fffffffffffffaf8);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT44(in_stack_fffffffffffffaac,in_stack_fffffffffffffaa8));
    std::allocator<char>::~allocator(&local_343);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT44(in_stack_fffffffffffffaac,in_stack_fffffffffffffaa8));
    std::allocator<char>::~allocator(&local_342);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT44(in_stack_fffffffffffffaac,in_stack_fffffffffffffaa8));
    std::allocator<char>::~allocator(local_341);
    iVar2 = sqlite3_exec(in_RDI[0x19],"BEGIN EXCLUSIVE TRANSACTION",0,0);
    if (iVar2 == 0) {
      iVar2 = sqlite3_exec(in_RDI[0x19],"COMMIT",0,0);
      if (iVar2 == 0) {
        sVar9 = in_RDI[0x19];
        paVar6 = &local_351;
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  (in_stack_fffffffffffffaf8,in_stack_fffffffffffffaf0,in_stack_fffffffffffffae8);
        paVar8 = &local_352;
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  (in_stack_fffffffffffffaf8,in_stack_fffffffffffffaf0,in_stack_fffffffffffffae8);
        paVar7 = &local_353;
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  (in_stack_fffffffffffffaf8,in_stack_fffffffffffffaf0,in_stack_fffffffffffffae8);
        SetPragma(in_stack_fffffffffffffb10,in_stack_fffffffffffffb08,in_stack_fffffffffffffb00,
                  in_stack_fffffffffffffaf8);
        std::__cxx11::string::~string
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   CONCAT44(in_stack_fffffffffffffaac,in_stack_fffffffffffffaa8));
        std::allocator<char>::~allocator(&local_353);
        std::__cxx11::string::~string
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   CONCAT44(in_stack_fffffffffffffaac,in_stack_fffffffffffffaa8));
        std::allocator<char>::~allocator(&local_352);
        std::__cxx11::string::~string
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   CONCAT44(in_stack_fffffffffffffaac,in_stack_fffffffffffffaa8));
        std::allocator<char>::~allocator(&local_351);
        if ((*(byte *)(in_RDI + 0x1a) & 1) != 0) {
          std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                    (in_stack_fffffffffffffac8,in_stack_fffffffffffffac0);
          std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                    (in_stack_fffffffffffffac8,in_stack_fffffffffffffac0);
          in_stack_fffffffffffffab0 =
               "WARNING SQLite is configured to not wait for data to be flushed to disk. Data loss and corruption may occur.\n"
          ;
          in_stack_fffffffffffffaa8 = 2;
          logging_function_00._M_str = (char *)paVar6;
          logging_function_00._M_len = sVar9;
          source_file_00._M_str = (char *)paVar8;
          source_file_00._M_len = (size_t)paVar7;
          LogPrintFormatInternal<>
                    (logging_function_00,source_file_00,iVar3,(LogFlags)in_stack_fffffffffffffb10,
                     in_stack_fffffffffffffc50,in_stack_fffffffffffffb58);
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    (in_stack_fffffffffffffaf8,in_stack_fffffffffffffaf0,in_stack_fffffffffffffae8);
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    (in_stack_fffffffffffffaf8,in_stack_fffffffffffffaf0,in_stack_fffffffffffffae8);
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    (in_stack_fffffffffffffaf8,in_stack_fffffffffffffaf0,in_stack_fffffffffffffae8);
          SetPragma(in_stack_fffffffffffffb10,in_stack_fffffffffffffb08,in_stack_fffffffffffffb00,
                    in_stack_fffffffffffffaf8);
          std::__cxx11::string::~string
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     CONCAT44(in_stack_fffffffffffffaac,in_stack_fffffffffffffaa8));
          std::allocator<char>::~allocator(&local_37b);
          std::__cxx11::string::~string
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     CONCAT44(in_stack_fffffffffffffaac,in_stack_fffffffffffffaa8));
          std::allocator<char>::~allocator(&local_37a);
          std::__cxx11::string::~string
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     CONCAT44(in_stack_fffffffffffffaac,in_stack_fffffffffffffaa8));
          std::allocator<char>::~allocator(local_379);
        }
        local_388 = 0;
        iVar3 = sqlite3_prepare_v2(in_RDI[0x19],
                                   "SELECT name FROM sqlite_master WHERE type=\'table\' AND name=\'main\'"
                                   ,0xffffffff,&local_388,0);
        if (iVar3 == 0) {
          iVar3 = sqlite3_step(local_388);
          iVar2 = sqlite3_finalize(local_388);
          if (iVar2 == 0) {
            if (iVar3 == 0x65) {
              bVar1 = false;
            }
            else {
              if (iVar3 != 100) {
                prVar5 = (runtime_error *)__cxa_allocate_exception(0x10);
                sqlite3_errstr(iVar3);
                tinyformat::format<char_const*>
                          ((char *)in_stack_fffffffffffffad8,(char **)in_stack_fffffffffffffad0);
                std::runtime_error::runtime_error(prVar5,local_230);
                if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
                  __cxa_throw(prVar5,&std::runtime_error::typeinfo,
                              std::runtime_error::~runtime_error);
                }
                goto LAB_017ab07b;
              }
              bVar1 = true;
            }
            if (!bVar1) {
              iVar3 = sqlite3_exec(in_RDI[0x19],
                                   "CREATE TABLE main(key BLOB PRIMARY KEY NOT NULL, value BLOB NOT NULL)"
                                   ,0,0);
              if (iVar3 != 0) {
                prVar5 = (runtime_error *)__cxa_allocate_exception(0x10);
                local_3a9._1_8_ = sqlite3_errstr(iVar3);
                tinyformat::format<char_const*>
                          ((char *)in_stack_fffffffffffffad8,(char **)in_stack_fffffffffffffad0);
                std::runtime_error::runtime_error(prVar5,local_250);
                if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
                  __cxa_throw(prVar5,&std::runtime_error::typeinfo,
                              std::runtime_error::~runtime_error);
                }
                goto LAB_017ab07b;
              }
              Params();
              CChainParams::MessageStart
                        ((CChainParams *)
                         CONCAT44(in_stack_fffffffffffffaac,in_stack_fffffffffffffaa8));
              std::array<unsigned_char,_4UL>::data
                        ((array<unsigned_char,_4UL> *)
                         CONCAT44(in_stack_fffffffffffffaac,in_stack_fffffffffffffaa8));
              ReadBE32((uchar *)in_stack_fffffffffffffab0);
              pcVar4 = (char *)in_RDI[0x19];
              this_00 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        local_3a9;
              std::allocator<char>::allocator();
              std::__cxx11::string::string<std::allocator<char>>
                        (this_00,pcVar4,in_stack_fffffffffffffae8);
              tinyformat::format<int>
                        ((char *)in_stack_fffffffffffffad8,(int *)in_stack_fffffffffffffad0);
              paVar6 = &local_3b1;
              std::allocator<char>::allocator();
              std::__cxx11::string::string<std::allocator<char>>(this_00,pcVar4,paVar6);
              SetPragma(in_stack_fffffffffffffb10,in_stack_fffffffffffffb08,
                        in_stack_fffffffffffffb00,this_00);
              std::__cxx11::string::~string
                        ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         CONCAT44(in_stack_fffffffffffffaac,in_stack_fffffffffffffaa8));
              std::allocator<char>::~allocator(&local_3b1);
              std::__cxx11::string::~string
                        ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         CONCAT44(in_stack_fffffffffffffaac,in_stack_fffffffffffffaa8));
              std::__cxx11::string::~string
                        ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         CONCAT44(in_stack_fffffffffffffaac,in_stack_fffffffffffffaa8));
              std::allocator<char>::~allocator(local_3a9);
              fmt = (char *)in_RDI[0x19];
              std::allocator<char>::allocator();
              std::__cxx11::string::string<std::allocator<char>>(this_00,pcVar4,paVar6);
              tinyformat::format<int>(fmt,(int *)in_stack_fffffffffffffad0);
              std::allocator<char>::allocator();
              std::__cxx11::string::string<std::allocator<char>>(this_00,pcVar4,paVar6);
              SetPragma(in_stack_fffffffffffffb10,in_stack_fffffffffffffb08,
                        in_stack_fffffffffffffb00,this_00);
              std::__cxx11::string::~string
                        ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         CONCAT44(in_stack_fffffffffffffaac,in_stack_fffffffffffffaa8));
              std::allocator<char>::~allocator(&local_3b3);
              std::__cxx11::string::~string
                        ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         CONCAT44(in_stack_fffffffffffffaac,in_stack_fffffffffffffaa8));
              std::__cxx11::string::~string
                        ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         CONCAT44(in_stack_fffffffffffffaac,in_stack_fffffffffffffaa8));
              std::allocator<char>::~allocator(&local_3b2);
            }
            if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
              return;
            }
          }
          else {
            prVar5 = (runtime_error *)__cxa_allocate_exception(0x10);
            sqlite3_errstr(iVar3);
            tinyformat::format<char_const*>
                      ((char *)in_stack_fffffffffffffad8,(char **)in_stack_fffffffffffffad0);
            std::runtime_error::runtime_error(prVar5,local_210);
            if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
              __cxa_throw(prVar5,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
            }
          }
        }
        else {
          prVar5 = (runtime_error *)__cxa_allocate_exception(0x10);
          sqlite3_errstr(iVar3);
          tinyformat::format<char_const*>
                    ((char *)in_stack_fffffffffffffad8,(char **)in_stack_fffffffffffffad0);
          std::runtime_error::runtime_error(prVar5,local_1f0);
          if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
            __cxa_throw(prVar5,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
          }
        }
      }
      else {
        prVar5 = (runtime_error *)__cxa_allocate_exception(0x10);
        local_350 = sqlite3_errstr(iVar2);
        tinyformat::format<char_const*>
                  ((char *)in_stack_fffffffffffffad8,(char **)in_stack_fffffffffffffad0);
        std::runtime_error::runtime_error(prVar5,local_110);
        if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
          __cxa_throw(prVar5,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
        }
      }
    }
    else {
      prVar5 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::runtime_error::runtime_error
                (prVar5,
                 "SQLiteDatabase: Unable to obtain an exclusive lock on the database, is it being used by another instance of Bitcoin Core?\n"
                );
      if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
        __cxa_throw(prVar5,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
      }
    }
  }
  else {
    prVar5 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error
              (prVar5,
               "SQLiteDatabase: Database opened in readonly mode but read-write permissions are needed"
              );
    if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
      __cxa_throw(prVar5,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
  }
LAB_017ab07b:
  __stack_chk_fail();
}

Assistant:

void SQLiteDatabase::Open()
{
    int flags = SQLITE_OPEN_FULLMUTEX | SQLITE_OPEN_READWRITE | SQLITE_OPEN_CREATE;
    if (m_mock) {
        flags |= SQLITE_OPEN_MEMORY; // In memory database for mock db
    }

    if (m_db == nullptr) {
        if (!m_mock) {
            TryCreateDirectories(fs::PathFromString(m_dir_path));
        }
        int ret = sqlite3_open_v2(m_file_path.c_str(), &m_db, flags, nullptr);
        if (ret != SQLITE_OK) {
            throw std::runtime_error(strprintf("SQLiteDatabase: Failed to open database: %s\n", sqlite3_errstr(ret)));
        }
        ret = sqlite3_extended_result_codes(m_db, 1);
        if (ret != SQLITE_OK) {
            throw std::runtime_error(strprintf("SQLiteDatabase: Failed to enable extended result codes: %s\n", sqlite3_errstr(ret)));
        }
        // Trace SQL statements if tracing is enabled with -debug=walletdb -loglevel=walletdb:trace
        if (LogAcceptCategory(BCLog::WALLETDB, BCLog::Level::Trace)) {
           ret = sqlite3_trace_v2(m_db, SQLITE_TRACE_STMT, TraceSqlCallback, this);
           if (ret != SQLITE_OK) {
               LogPrintf("Failed to enable SQL tracing for %s\n", Filename());
           }
        }
    }

    if (sqlite3_db_readonly(m_db, "main") != 0) {
        throw std::runtime_error("SQLiteDatabase: Database opened in readonly mode but read-write permissions are needed");
    }

    // Acquire an exclusive lock on the database
    // First change the locking mode to exclusive
    SetPragma(m_db, "locking_mode", "exclusive", "Unable to change database locking mode to exclusive");
    // Now begin a transaction to acquire the exclusive lock. This lock won't be released until we close because of the exclusive locking mode.
    int ret = sqlite3_exec(m_db, "BEGIN EXCLUSIVE TRANSACTION", nullptr, nullptr, nullptr);
    if (ret != SQLITE_OK) {
        throw std::runtime_error("SQLiteDatabase: Unable to obtain an exclusive lock on the database, is it being used by another instance of " PACKAGE_NAME "?\n");
    }
    ret = sqlite3_exec(m_db, "COMMIT", nullptr, nullptr, nullptr);
    if (ret != SQLITE_OK) {
        throw std::runtime_error(strprintf("SQLiteDatabase: Unable to end exclusive lock transaction: %s\n", sqlite3_errstr(ret)));
    }

    // Enable fullfsync for the platforms that use it
    SetPragma(m_db, "fullfsync", "true", "Failed to enable fullfsync");

    if (m_use_unsafe_sync) {
        // Use normal synchronous mode for the journal
        LogPrintf("WARNING SQLite is configured to not wait for data to be flushed to disk. Data loss and corruption may occur.\n");
        SetPragma(m_db, "synchronous", "OFF", "Failed to set synchronous mode to OFF");
    }

    // Make the table for our key-value pairs
    // First check that the main table exists
    sqlite3_stmt* check_main_stmt{nullptr};
    ret = sqlite3_prepare_v2(m_db, "SELECT name FROM sqlite_master WHERE type='table' AND name='main'", -1, &check_main_stmt, nullptr);
    if (ret != SQLITE_OK) {
        throw std::runtime_error(strprintf("SQLiteDatabase: Failed to prepare statement to check table existence: %s\n", sqlite3_errstr(ret)));
    }
    ret = sqlite3_step(check_main_stmt);
    if (sqlite3_finalize(check_main_stmt) != SQLITE_OK) {
        throw std::runtime_error(strprintf("SQLiteDatabase: Failed to finalize statement checking table existence: %s\n", sqlite3_errstr(ret)));
    }
    bool table_exists;
    if (ret == SQLITE_DONE) {
        table_exists = false;
    } else if (ret == SQLITE_ROW) {
        table_exists = true;
    } else {
        throw std::runtime_error(strprintf("SQLiteDatabase: Failed to execute statement to check table existence: %s\n", sqlite3_errstr(ret)));
    }

    // Do the db setup things because the table doesn't exist only when we are creating a new wallet
    if (!table_exists) {
        ret = sqlite3_exec(m_db, "CREATE TABLE main(key BLOB PRIMARY KEY NOT NULL, value BLOB NOT NULL)", nullptr, nullptr, nullptr);
        if (ret != SQLITE_OK) {
            throw std::runtime_error(strprintf("SQLiteDatabase: Failed to create new database: %s\n", sqlite3_errstr(ret)));
        }

        // Set the application id
        uint32_t app_id = ReadBE32(Params().MessageStart().data());
        SetPragma(m_db, "application_id", strprintf("%d", static_cast<int32_t>(app_id)),
                  "Failed to set the application id");

        // Set the user version
        SetPragma(m_db, "user_version", strprintf("%d", WALLET_SCHEMA_VERSION),
                  "Failed to set the wallet schema version");
    }
}